

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O0

void absl::substitute_internal::SubstituteAndAppendArray
               (Nonnull<std::string_*> output,string_view format,
               Nullable<const_absl::string_view_*> args_array,size_t num_args)

{
  string_view src_00;
  string_view src_01;
  string_view src_02;
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong uVar5;
  undefined8 uVar6;
  uchar *puVar7;
  unsigned_long uVar8;
  size_t *psVar9;
  long lVar10;
  long lVar11;
  long in_RCX;
  char *in_RDX;
  size_t in_RSI;
  ulong in_RDI;
  ulong in_R8;
  string_view src;
  size_t i_1;
  char *target;
  char *absl_raw_log_internal_filename;
  string death_message;
  size_t original_size;
  char *absl_raw_log_internal_basename_2;
  char *absl_raw_log_internal_basename_1;
  int index;
  char *absl_raw_log_internal_basename;
  size_t i;
  size_t size;
  int *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  LogSeverity *in_stack_fffffffffffffde8;
  AtomicHook<void_(*)(absl::LogSeverity,_const_char_*,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffdf0;
  char *pcVar12;
  allocator<char> *in_stack_fffffffffffffe10;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe18;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  ulong local_180;
  char *local_178;
  undefined4 local_170;
  undefined4 local_16c;
  allocator<char> local_131;
  string local_130 [32];
  long local_110;
  size_t local_108;
  char *pcStack_100;
  string local_f0 [32];
  char *local_d0;
  size_t local_c8;
  char *pcStack_c0;
  string local_b0 [32];
  char *local_90;
  uint local_88;
  size_t local_78;
  char *pcStack_70;
  string local_60 [32];
  char *local_40;
  ulong local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  ulong local_28;
  long local_20;
  ulong local_18;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDI;
  local_10._M_len = in_RSI;
  local_10._M_str = in_RDX;
  for (local_38 = 0; uVar5 = local_38,
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10), uVar5 < sVar3;
      local_38 = local_38 + 1) {
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_10,local_38);
    if (*pvVar4 == '$') {
      uVar5 = local_38 + 1;
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
      if (sVar3 <= uVar5) {
        local_40 = "substitute.cc";
        local_78 = local_10._M_len;
        pcStack_70 = local_10._M_str;
        src_00._M_str = in_stack_fffffffffffffe18;
        src_00._M_len = (size_t)in_stack_fffffffffffffe10;
        CEscape_abi_cxx11_(src_00);
        uVar6 = std::__cxx11::string::c_str();
        raw_log_internal::RawLog
                  (kFatal,"substitute.cc",0x31,"Invalid absl::Substitute() format string: \"%s\".",
                   uVar6);
        std::__cxx11::string::~string(local_60);
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/substitute.cc"
                      ,0x31,
                      "void absl::substitute_internal::SubstituteAndAppendArray(absl::Nonnull<std::string *>, absl::string_view, absl::Nullable<const absl::string_view *>, size_t)"
                     );
      }
      puVar7 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                  (&local_10,local_38 + 1);
      bVar1 = ascii_isdigit(*puVar7);
      if (bVar1) {
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (&local_10,local_38 + 1);
        uVar2 = (int)*pvVar4 - 0x30;
        local_88 = uVar2;
        if (local_28 <= (ulong)(long)(int)uVar2) {
          local_90 = "substitute.cc";
          local_c8 = local_10._M_len;
          pcStack_c0 = local_10._M_str;
          src_01._M_str = in_stack_fffffffffffffe18;
          src_01._M_len = (size_t)in_stack_fffffffffffffe10;
          CEscape_abi_cxx11_(src_01);
          uVar6 = std::__cxx11::string::c_str();
          raw_log_internal::RawLog
                    (kFatal,"substitute.cc",0x3e,
                     "Invalid absl::Substitute() format string: asked for \"$%d\", but only %d args were given.  Full format string was: \"%s\"."
                     ,(ulong)uVar2,local_28 & 0xffffffff,uVar6);
          std::__cxx11::string::~string(local_b0);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/substitute.cc"
                        ,0x3e,
                        "void absl::substitute_internal::SubstituteAndAppendArray(absl::Nonnull<std::string *>, absl::string_view, absl::Nullable<const absl::string_view *>, size_t)"
                       );
        }
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           (local_20 + (long)(int)uVar2 * 0x10));
        local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (&local_30->_M_dataplus + sVar3);
      }
      else {
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (&local_10,local_38 + 1);
        if (*pvVar4 != '$') {
          local_d0 = "substitute.cc";
          local_108 = local_10._M_len;
          pcStack_100 = local_10._M_str;
          src_02._M_str = in_stack_fffffffffffffe18;
          src_02._M_len = (size_t)in_stack_fffffffffffffe10;
          CEscape_abi_cxx11_(src_02);
          uVar6 = std::__cxx11::string::c_str();
          raw_log_internal::RawLog
                    (kFatal,"substitute.cc",0x4b,"Invalid absl::Substitute() format string: \"%s\"."
                     ,uVar6);
          std::__cxx11::string::~string(local_f0);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/substitute.cc"
                        ,0x4b,
                        "void absl::substitute_internal::SubstituteAndAppendArray(absl::Nonnull<std::string *>, absl::string_view, absl::Nullable<const absl::string_view *>, size_t)"
                       );
        }
        local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_30->field_0x1;
      }
      local_38 = local_38 + 1;
    }
    else {
      local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_30->field_0x1;
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_110 = std::__cxx11::string::size();
    this = local_30;
    uVar8 = std::numeric_limits<unsigned_long>::max();
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar8 - local_110) <
        this) {
      __s = &local_131;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,in_stack_fffffffffffffe10)
      ;
      std::allocator<char>::~allocator(&local_131);
      __a = (allocator<char> *)&stack0xfffffffffffffea7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
      std::__cxx11::string::operator+=(local_130,(string *)&stack0xfffffffffffffea8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffea7);
      local_16c = 3;
      local_170 = 0x5a;
      base_internal::
      AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::operator()
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                 (char **)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3c4a9b);
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/substitute.cc"
                    ,0x5a,
                    "void absl::substitute_internal::SubstituteAndAppendArray(absl::Nonnull<std::string *>, absl::string_view, absl::Nullable<const absl::string_view *>, size_t)"
                   );
    }
    strings_internal::STLStringResizeUninitializedAmortized<std::__cxx11::string>
              (in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
    local_178 = (char *)std::__cxx11::string::operator[](local_18);
    for (local_180 = 0; uVar5 = local_180,
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10),
        uVar5 < sVar3; local_180 = local_180 + 1) {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (&local_10,local_180);
      if (*pvVar4 == '$') {
        puVar7 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                    (&local_10,local_180 + 1);
        bVar1 = ascii_isdigit(*puVar7);
        lVar10 = local_20;
        if (bVar1) {
          pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             (&local_10,local_180 + 1);
          psVar9 = (size_t *)(lVar10 + (long)(*pvVar4 + -0x30) * 0x10);
          local_190._M_len = *psVar9;
          local_190._M_str = (char *)psVar9[1];
          std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_190);
          std::basic_string_view<char,_std::char_traits<char>_>::end(&local_190);
          local_178 = std::copy<char_const*,char*>
                                ((char *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8
                                 ,(char *)in_stack_fffffffffffffde0);
          local_180 = local_180 + 1;
        }
        else {
          pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             (&local_10,local_180 + 1);
          if (*pvVar4 == '$') {
            *local_178 = '$';
            local_180 = local_180 + 1;
            local_178 = local_178 + 1;
          }
        }
      }
      else {
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (&local_10,local_180);
        *local_178 = *pvVar4;
        local_178 = local_178 + 1;
      }
    }
    pcVar12 = local_178;
    lVar10 = std::__cxx11::string::data();
    lVar11 = std::__cxx11::string::size();
    if (pcVar12 != (char *)(lVar10 + lVar11)) {
      __assert_fail("target == output->data() + output->size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/substitute.cc"
                    ,0x6d,
                    "void absl::substitute_internal::SubstituteAndAppendArray(absl::Nonnull<std::string *>, absl::string_view, absl::Nullable<const absl::string_view *>, size_t)"
                   );
    }
  }
  return;
}

Assistant:

void SubstituteAndAppendArray(
    absl::Nonnull<std::string*> output, absl::string_view format,
    absl::Nullable<const absl::string_view*> args_array, size_t num_args) {
  // Determine total size needed.
  size_t size = 0;
  for (size_t i = 0; i < format.size(); i++) {
    if (format[i] == '$') {
      if (i + 1 >= format.size()) {
#ifndef NDEBUG
        ABSL_RAW_LOG(FATAL,
                     "Invalid absl::Substitute() format string: \"%s\".",
                     absl::CEscape(format).c_str());
#endif
        return;
      } else if (absl::ascii_isdigit(
                     static_cast<unsigned char>(format[i + 1]))) {
        int index = format[i + 1] - '0';
        if (static_cast<size_t>(index) >= num_args) {
#ifndef NDEBUG
          ABSL_RAW_LOG(
              FATAL,
              "Invalid absl::Substitute() format string: asked for \"$"
              "%d\", but only %d args were given.  Full format string was: "
              "\"%s\".",
              index, static_cast<int>(num_args), absl::CEscape(format).c_str());
#endif
          return;
        }
        size += args_array[index].size();
        ++i;  // Skip next char.
      } else if (format[i + 1] == '$') {
        ++size;
        ++i;  // Skip next char.
      } else {
#ifndef NDEBUG
        ABSL_RAW_LOG(FATAL,
                     "Invalid absl::Substitute() format string: \"%s\".",
                     absl::CEscape(format).c_str());
#endif
        return;
      }
    } else {
      ++size;
    }
  }

  if (size == 0) return;

  // Build the string.
  size_t original_size = output->size();
  ABSL_INTERNAL_CHECK(
      size <= std::numeric_limits<size_t>::max() - original_size,
      "size_t overflow");
  strings_internal::STLStringResizeUninitializedAmortized(output,
                                                          original_size + size);
  char* target = &(*output)[original_size];
  for (size_t i = 0; i < format.size(); i++) {
    if (format[i] == '$') {
      if (absl::ascii_isdigit(static_cast<unsigned char>(format[i + 1]))) {
        const absl::string_view src = args_array[format[i + 1] - '0'];
        target = std::copy(src.begin(), src.end(), target);
        ++i;  // Skip next char.
      } else if (format[i + 1] == '$') {
        *target++ = '$';
        ++i;  // Skip next char.
      }
    } else {
      *target++ = format[i];
    }
  }

  assert(target == output->data() + output->size());
}